

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

ValueType __thiscall
draco::PointAttribute::DeduplicateValues
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  uint uVar1;
  ValueType VVar2;
  
  VVar2 = 0xffffffff;
  switch(in_att->data_type_) {
  case DT_INT8:
    uVar1 = DeduplicateTypedValues<signed_char>(this,in_att,in_att_offset);
    break;
  case DT_UINT8:
  case DT_BOOL:
    uVar1 = DeduplicateTypedValues<unsigned_char>(this,in_att,in_att_offset);
    break;
  case DT_INT16:
    uVar1 = DeduplicateTypedValues<short>(this,in_att,in_att_offset);
    break;
  case DT_UINT16:
    uVar1 = DeduplicateTypedValues<unsigned_short>(this,in_att,in_att_offset);
    break;
  case DT_INT32:
    uVar1 = DeduplicateTypedValues<int>(this,in_att,in_att_offset);
    break;
  case DT_UINT32:
    uVar1 = DeduplicateTypedValues<unsigned_int>(this,in_att,in_att_offset);
    break;
  default:
    goto switchD_00139616_caseD_7;
  case DT_FLOAT32:
    uVar1 = DeduplicateTypedValues<float>(this,in_att,in_att_offset);
  }
  VVar2 = -(uint)(uVar1 == 0) | uVar1;
switchD_00139616_caseD_7:
  return VVar2;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  AttributeValueIndex::ValueType unique_vals = 0;
  switch (in_att.data_type()) {
    // Currently we support only float, uint8, and uint16 arguments.
    case DT_FLOAT32:
      unique_vals = DeduplicateTypedValues<float>(in_att, in_att_offset);
      break;
    case DT_INT8:
      unique_vals = DeduplicateTypedValues<int8_t>(in_att, in_att_offset);
      break;
    case DT_UINT8:
    case DT_BOOL:
      unique_vals = DeduplicateTypedValues<uint8_t>(in_att, in_att_offset);
      break;
    case DT_UINT16:
      unique_vals = DeduplicateTypedValues<uint16_t>(in_att, in_att_offset);
      break;
    case DT_INT16:
      unique_vals = DeduplicateTypedValues<int16_t>(in_att, in_att_offset);
      break;
    case DT_UINT32:
      unique_vals = DeduplicateTypedValues<uint32_t>(in_att, in_att_offset);
      break;
    case DT_INT32:
      unique_vals = DeduplicateTypedValues<int32_t>(in_att, in_att_offset);
      break;
    default:
      return -1;  // Unsupported data type.
  }
  if (unique_vals == 0) {
    return -1;  // Unexpected error.
  }
  return unique_vals;
}